

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall nivalis::ParseSession::_mk_tok_link(ParseSession *this)

{
  byte bVar1;
  iterator __position;
  pointer plVar2;
  void *pvVar3;
  long *plVar4;
  ostream *poVar5;
  string *psVar6;
  bool bVar7;
  long lVar8;
  vector<long,std::allocator<long>> *this_00;
  long lVar9;
  vector<long,_std::allocator<long>_> starts [3];
  stringstream error_msg_stream;
  long local_238;
  byte local_230;
  undefined7 uStack_22f;
  long local_220 [3];
  undefined8 local_208;
  long alStack_200 [9];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  alStack_200[5] = 0;
  alStack_200[6] = 0;
  alStack_200[3] = 0;
  alStack_200[4] = 0;
  alStack_200[1] = 0;
  alStack_200[2] = 0;
  local_208 = 0;
  alStack_200[0] = 0;
  alStack_200[7] = 0;
  local_238 = 0;
  psVar6 = this->expr;
  if ((long)psVar6->_M_string_length < 1) {
    lVar8 = -1;
  }
  else {
    local_220[2] = -1;
    do {
      bVar1 = (psVar6->_M_dataplus)._M_p[local_238];
      if (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
         (((bVar1 - 0x24 < 0x3d &&
           ((0x1800000010000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0)) ||
          (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10)))) {
        if (local_220[2] == -1) {
          local_220[2] = local_238;
        }
      }
      else {
        if (local_220[2] != -1) {
          plVar2 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          plVar2[local_220[2]] = local_238 + -1;
          plVar2[local_238 + -1] = local_220[2];
        }
        local_220[2] = -1;
      }
      this_00 = (vector<long,std::allocator<long>> *)&local_208;
      lVar8 = 0;
      do {
        if (bVar1 == "([{"[lVar8]) {
          __position._M_current = *(long **)(this_00 + 8);
          if (__position._M_current == *(long **)(this_00 + 0x10)) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (this_00,__position,&local_238);
          }
          else {
            *__position._M_current = local_238;
            *(long **)(this_00 + 8) = __position._M_current + 1;
          }
        }
        else if (bVar1 == ")]}"[lVar8]) {
          lVar9 = *(long *)(this_00 + 8);
          if (*(long *)this_00 == lVar9) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unmatched \'",0xb);
            local_230 = bVar1;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)&local_230,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
            psVar6 = this->error_msg;
            if (psVar6 != (string *)0x0) {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(uStack_22f,local_230));
              if ((long *)CONCAT71(uStack_22f,local_230) != local_220) {
                operator_delete((long *)CONCAT71(uStack_22f,local_230),local_220[0] + 1);
              }
            }
            if (this->quiet == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Unmatched \'",0xb);
              local_230 = bVar1;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)&local_230,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
            }
            goto LAB_0010cb55;
          }
          plVar2 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          plVar2[*(long *)(lVar9 + -8)] = local_238;
          plVar2[local_238] = *(long *)(lVar9 + -8);
          *(long *)(this_00 + 8) = lVar9 + -8;
        }
        lVar8 = lVar8 + 1;
        this_00 = this_00 + 0x18;
      } while (lVar8 != 3);
      local_238 = local_238 + 1;
      psVar6 = this->expr;
      lVar8 = local_220[2];
    } while (local_238 < (long)psVar6->_M_string_length);
  }
  plVar4 = alStack_200;
  lVar9 = 0;
  do {
    if (plVar4[-1] != *plVar4) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unmatched \'",0xb);
      bVar1 = "([{"[lVar9];
      local_230 = bVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_230,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
      psVar6 = this->error_msg;
      if (psVar6 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(uStack_22f,local_230));
        if ((long *)CONCAT71(uStack_22f,local_230) != local_220) {
          operator_delete((long *)CONCAT71(uStack_22f,local_230),local_220[0] + 1);
        }
      }
      if (this->quiet == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Unmatched \'",0xb)
        ;
        local_230 = bVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_230,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
      }
LAB_0010cb55:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      bVar7 = false;
      goto LAB_0010cb78;
    }
    lVar9 = lVar9 + 1;
    plVar4 = plVar4 + 3;
  } while (lVar9 != 3);
  bVar7 = true;
  if (lVar8 != -1) {
    psVar6 = this->expr;
    plVar2 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar2[lVar8] = psVar6->_M_string_length - 1;
    plVar2[psVar6->_M_string_length - 1] = lVar8;
  }
LAB_0010cb78:
  lVar8 = 0x48;
  do {
    pvVar3 = *(void **)((long)local_220 + lVar8);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)local_220 + lVar8 + 0x10) - (long)pvVar3);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  return bVar7;
}

Assistant:

bool _mk_tok_link() {
        // Parenthesis matching
        static const char lb[] = "([{", rb[] = ")]}";
        std::vector<int64_t> starts[3];
        int64_t lit_start = -1;
        for (int64_t pos = 0; pos < static_cast<int64_t>(expr.size()); ++pos) {
            const char c = expr[pos];
            if (util::is_identifier(c)) {
                if (lit_start == -1) lit_start = pos;
            } else {
                if (lit_start != -1) {
                    tok_link[lit_start] = pos-1;
                    tok_link[pos-1] = lit_start;
                    lit_start = -1;
                }
            }
            for (int i = 0; i < 3; ++i) {
                if (c == lb[i]) {
                    starts[i].push_back(pos);
                } else if (c == rb[i]) {
                    if (starts[i].empty()) {
                        PARSE_ERR("Unmatched '" << rb[i] << "'\n");
                    }
                    tok_link[starts[i].back()] = pos;
                    tok_link[pos] = starts[i].back();
                    starts[i].pop_back();
                }
            }
        }
        for (int i = 0; i < 3; ++i) {
            if (!starts[i].empty()) {
                PARSE_ERR("Unmatched '" << lb[i] << "'\n");
            }
        }
        if (lit_start != -1) {
            tok_link[lit_start] = static_cast<int64_t>(expr.size()) - 1;
            tok_link[expr.size() - 1] = lit_start;
            lit_start = -1;
        }
        lit_start = -1;
        return true;
    }